

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall
protozero::Message::AppendVarInt<perfetto::protos::gen::ChromeFrameReporter_FrameType>
          (Message *this,uint32_t field_id,ChromeFrameReporter_FrameType value)

{
  uint32_t value_00;
  uint8_t *puVar1;
  uint8_t *pos;
  uint8_t buffer [15];
  ChromeFrameReporter_FrameType value_local;
  uint32_t field_id_local;
  Message *this_local;
  
  buffer._7_4_ = value;
  buffer._11_4_ = field_id;
  if (this->nested_message_ != (Message *)0x0) {
    EndNestedMessage(this);
  }
  value_00 = proto_utils::MakeTagVarInt(buffer._11_4_);
  puVar1 = proto_utils::WriteVarInt<unsigned_int>(value_00,(uint8_t *)((long)&pos + 1));
  puVar1 = proto_utils::WriteVarInt<perfetto::protos::gen::ChromeFrameReporter_FrameType>
                     (buffer._7_4_,puVar1);
  WriteToStream(this,(uint8_t *)((long)&pos + 1),puVar1);
  return;
}

Assistant:

void AppendVarInt(uint32_t field_id, T value) {
    if (nested_message_)
      EndNestedMessage();

    uint8_t buffer[proto_utils::kMaxSimpleFieldEncodedSize];
    uint8_t* pos = buffer;

    pos = proto_utils::WriteVarInt(proto_utils::MakeTagVarInt(field_id), pos);
    // WriteVarInt encodes signed values in two's complement form.
    pos = proto_utils::WriteVarInt(value, pos);
    WriteToStream(buffer, pos);
  }